

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

void __thiscall ccd::Json::Value::Value(Value *this,string *value)

{
  string *value_local;
  Value *this_local;
  
  this->m_type = String;
  std::
  variant<int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
  ::variant<std::__cxx11::string_const&,void,void,std::__cxx11::string,void>
            ((variant<int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
              *)&this->m_value,value);
  return;
}

Assistant:

Value::Value ( const std::string& value ) : m_type ( Type::String ), m_value ( value ) {}